

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

type cm::operator==(StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *l,basic_string_view<char,_std::char_traits<char>_> *r)

{
  type tVar1;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  string local_30;
  
  StringOpPlus::operator_cast_to_string(&local_30,(StringOpPlus *)l);
  local_40._M_len = r->_M_len;
  local_40._M_str = r->_M_str;
  tVar1 = operator==(&local_30,&local_40);
  std::__cxx11::string::~string((string *)&local_30);
  return tVar1;
}

Assistant:

typename std::enable_if<AsStringView<R>::value, bool>::type operator==(
  StringOpPlus<LL, LR> const& l, R&& r)
{
  return std::string(l) == AsStringView<R>::view(std::forward<R>(r));
}